

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MiscStatements.cpp
# Opt level: O3

Statement *
slang::ast::ProceduralDeassignStatement::fromSyntax
          (Compilation *compilation,ProceduralDeassignStatementSyntax *syntax,ASTContext *context)

{
  bool bVar1;
  Expression *args;
  ProceduralDeassignStatement *stmt;
  Statement *pSVar2;
  DiagCode code;
  bool isRelease;
  ASTContext ctx;
  bool local_69;
  SourceRange local_68;
  ASTContext local_58;
  
  ASTContext::resetFlags(&local_58,context,(bitmask<slang::ast::ASTFlags>)0x40000020);
  args = Expression::bindLValue
                   ((syntax->variable).ptr,&local_58,(bitmask<slang::ast::AssignFlags>)0x0);
  local_69 = (syntax->keyword).kind == ReleaseKeyword;
  local_68 = slang::syntax::SyntaxNode::sourceRange((SyntaxNode *)syntax);
  stmt = BumpAllocator::
         emplace<slang::ast::ProceduralDeassignStatement,slang::ast::Expression_const&,bool&,slang::SourceRange>
                   (&compilation->super_BumpAllocator,args,&local_69,&local_68);
  bVar1 = Expression::bad(args);
  if (!bVar1) {
    if (local_69 == true) {
      bVar1 = isValidForceLVal(args,&local_58,false);
      code.subsystem = Statements;
      code.code = 0x55;
    }
    else {
      bVar1 = isValidAssignLVal(args);
      code.subsystem = Statements;
      code.code = 4;
    }
    if (bVar1 != false) {
      return &stmt->super_Statement;
    }
    ASTContext::addDiag(&local_58,code,args->sourceRange);
  }
  pSVar2 = Statement::badStmt(compilation,&stmt->super_Statement);
  return pSVar2;
}

Assistant:

Statement& ProceduralDeassignStatement::fromSyntax(Compilation& compilation,
                                                   const ProceduralDeassignStatementSyntax& syntax,
                                                   const ASTContext& context) {
    auto ctx = context.resetFlags(ASTFlags::NonProcedural | ASTFlags::ProceduralForceRelease);
    auto& lvalue = Expression::bindLValue(*syntax.variable, ctx);

    bool isRelease = syntax.keyword.kind == TokenKind::ReleaseKeyword;
    auto result = compilation.emplace<ProceduralDeassignStatement>(lvalue, isRelease,
                                                                   syntax.sourceRange());
    if (lvalue.bad())
        return badStmt(compilation, result);

    if (isRelease) {
        if (!isValidForceLVal(lvalue, ctx, false)) {
            ctx.addDiag(diag::BadProceduralForce, lvalue.sourceRange);
            return badStmt(compilation, result);
        }
    }
    else {
        if (!isValidAssignLVal(lvalue)) {
            ctx.addDiag(diag::BadProceduralAssign, lvalue.sourceRange);
            return badStmt(compilation, result);
        }
    }

    return *result;
}